

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O1

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Train::getPosibleCollisions
          (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
           *__return_storage_ptr__,Train *this,MoveModel *move)

{
  pointer *pppTVar1;
  World *pWVar2;
  pointer ppTVar3;
  iterator iVar4;
  Train *pTVar5;
  pointer ppLVar6;
  int iVar7;
  int iVar8;
  SpeedType SVar9;
  Point *pPVar10;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar11;
  __normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  _Var12;
  Line *pLVar13;
  Point *pPVar14;
  Writer *pWVar15;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar16;
  uint uVar17;
  uint uVar18;
  pointer ppTVar19;
  pointer ppLVar20;
  Train *pTVar21;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> edges;
  Train *train;
  int local_d4;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> local_c8;
  Writer local_b0;
  Line *local_40;
  pointer local_38;
  
  local_d4 = this->position;
  pLVar13 = this->line;
  if (move != (MoveModel *)0x0) {
    iVar7 = models::MoveModel::getLineIdx(move);
    iVar8 = Line::getIdx(pLVar13);
    if (iVar7 != iVar8) {
      pPVar10 = getPoint(this);
      if (pPVar10 == (Point *)0x0) {
        local_b0._vptr_Writer = (_func_int **)&PTR__Writer_00183bb0;
        local_b0.m_level = Error;
        local_b0.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_b0.m_line = 0xc2;
        local_b0.m_func =
             "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_b0.m_verboseLevel = 0;
        local_b0.m_logger = (Logger *)0x0;
        local_b0.m_proceed = false;
        local_b0.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b0.m_messageBuilder.m_containerLogSeperator = "";
        local_b0.m_dispatchAction = NormalLog;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar15 = el::base::Writer::construct(&local_b0,1,"default");
        if (pWVar15->m_proceed == true) {
          el::base::MessageBuilder::operator<<
                    (&pWVar15->m_messageBuilder,"Bad move command for predictions.");
        }
        goto LAB_0014c9dc;
      }
      pPVar10 = getPoint(this);
      pvVar11 = Point::getEdges(pPVar10);
      std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::
      vector(&local_c8,pvVar11);
      ppLVar6 = local_c8.
                super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppLVar20 = local_c8.
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pWVar2 = this->owner;
      iVar7 = models::MoveModel::getLineIdx(move);
      local_b0._vptr_Writer = (_func_int **)World::getLineByIdx(pWVar2,iVar7);
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<tiger::trains::world::Line**,std::vector<tiger::trains::world::Line*,std::allocator<tiger::trains::world::Line*>>>,__gnu_cxx::__ops::_Iter_equals_val<tiger::trains::world::Line*const>>
                         (ppLVar20,ppLVar6);
      if (_Var12._M_current ==
          local_c8.
          super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_b0._vptr_Writer = (_func_int **)&PTR__Writer_00183bb0;
        local_b0.m_level = Error;
        local_b0.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_b0.m_line = 0xca;
        local_b0.m_func =
             "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_b0.m_verboseLevel = 0;
        local_b0.m_logger = (Logger *)0x0;
        local_b0.m_proceed = false;
        local_b0.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b0.m_messageBuilder.m_containerLogSeperator = "";
        local_b0.m_dispatchAction = NormalLog;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar15 = el::base::Writer::construct(&local_b0,1,"default");
        if (pWVar15->m_proceed == true) {
          el::base::MessageBuilder::operator<<
                    (&pWVar15->m_messageBuilder,"Bad move command for predictions.");
        }
        el::base::Writer::~Writer(&local_b0);
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        pWVar2 = this->owner;
        iVar7 = models::MoveModel::getLineIdx(move);
        pLVar13 = World::getLineByIdx(pWVar2,iVar7);
        pPVar10 = Line::getStartPont(pLVar13);
        pPVar14 = getPoint(this);
        if (pPVar10 == pPVar14) {
          local_d4 = 0;
        }
        else {
          local_d4 = Line::getLenght(pLVar13);
        }
      }
      if ((Train *)local_c8.
                   super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                   ._M_impl.super__Vector_impl_data._M_start != (Train *)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (_Var12._M_current ==
          local_c8.
          super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
    }
    SVar9 = models::MoveModel::getSpeedType(move);
    if (SVar9 == FORWARD) {
      iVar7 = Line::getLenght(pLVar13);
      if (local_d4 == iVar7) {
        local_b0._vptr_Writer = (_func_int **)&PTR__Writer_00183bb0;
        local_b0.m_level = Error;
        local_b0.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_b0.m_line = 0xd6;
        local_b0.m_func =
             "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_b0.m_verboseLevel = 0;
        local_b0.m_logger = (Logger *)0x0;
        local_b0.m_proceed = false;
        local_b0.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b0.m_messageBuilder.m_containerLogSeperator = "";
        local_b0.m_dispatchAction = NormalLog;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar15 = el::base::Writer::construct(&local_b0,1,"default");
        if (pWVar15->m_proceed == true) {
          el::base::MessageBuilder::operator<<
                    (&pWVar15->m_messageBuilder,"Bad move command for predictions.");
        }
        goto LAB_0014c9dc;
      }
      local_d4 = local_d4 + 1;
    }
    SVar9 = models::MoveModel::getSpeedType(move);
    if (SVar9 == REVERSE) {
      if (local_d4 == 0) {
        local_b0._vptr_Writer = (_func_int **)&PTR__Writer_00183bb0;
        local_b0.m_level = Error;
        local_b0.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_b0.m_line = 0xe1;
        local_b0.m_func =
             "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_b0.m_verboseLevel = 0;
        local_b0.m_logger = (Logger *)0x0;
        local_b0.m_proceed = false;
        local_b0.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b0.m_messageBuilder.m_containerLogSeperator = "";
        local_b0.m_dispatchAction = NormalLog;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar15 = el::base::Writer::construct(&local_b0,1,"default");
        if (pWVar15->m_proceed == true) {
          el::base::MessageBuilder::operator<<
                    (&pWVar15->m_messageBuilder,"Bad move command for predictions.");
        }
LAB_0014c9dc:
        el::base::Writer::~Writer(&local_b0);
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      local_d4 = local_d4 + -1;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar16 = Line::getTrains(this->line);
  ppTVar19 = (pvVar16->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (pvVar16->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar19 != ppTVar3) {
    do {
      local_b0._vptr_Writer = (_func_int **)*ppTVar19;
      if ((Train *)local_b0._vptr_Writer != this) {
        uVar17 = local_d4 - ((Train *)local_b0._vptr_Writer)->position;
        uVar18 = -uVar17;
        if (0 < (int)uVar17) {
          uVar18 = uVar17;
        }
        if (uVar18 < 2) {
          iVar4._M_current =
               (__return_storage_ptr__->
               super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>::
            _M_realloc_insert<tiger::trains::world::Train*const&>
                      ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                        *)__return_storage_ptr__,iVar4,(Train **)&local_b0);
          }
          else {
            *iVar4._M_current = (Train *)local_b0._vptr_Writer;
            pppTVar1 = &(__return_storage_ptr__->
                        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
        }
      }
      ppTVar19 = ppTVar19 + 1;
    } while (ppTVar19 != ppTVar3);
  }
  if (local_d4 == 0) {
    pPVar10 = Line::getStartPont(pLVar13);
  }
  else {
    pPVar10 = (Point *)0x0;
  }
  iVar7 = Line::getLenght(pLVar13);
  if (local_d4 == iVar7) {
    pPVar10 = Line::getStartPont(pLVar13);
  }
  local_40 = pLVar13;
  if (pPVar10 != (Point *)0x0) {
    pvVar11 = Point::getEdges(pPVar10);
    ppLVar20 = (pvVar11->
               super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_38 = (pvVar11->
               super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar20 != local_38) {
      do {
        pLVar13 = *ppLVar20;
        pvVar16 = Line::getTrains(pLVar13);
        ppTVar3 = (pvVar16->
                  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppTVar19 = (pvVar16->
                        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppTVar19 != ppTVar3;
            ppTVar19 = ppTVar19 + 1) {
          local_b0._vptr_Writer = (_func_int **)*ppTVar19;
          pPVar14 = Line::getStartPont(pLVar13);
          if ((pPVar14 == pPVar10) && (*(int *)((long)local_b0._vptr_Writer + 0x34) < 2)) {
            iVar4._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
              ::_M_realloc_insert<tiger::trains::world::Train*const&>
                        ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                          *)__return_storage_ptr__,iVar4,(Train **)&local_b0);
            }
            else {
              *iVar4._M_current = (Train *)local_b0._vptr_Writer;
              pppTVar1 = &(__return_storage_ptr__->
                          super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
          }
          pPVar14 = Line::getEndPont(pLVar13);
          if ((pPVar14 == pPVar10) &&
             (iVar7 = *(int *)((long)local_b0._vptr_Writer + 0x34), iVar8 = Line::getLenght(pLVar13)
             , iVar8 + -2 < iVar7)) {
            iVar4._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
              ::_M_realloc_insert<tiger::trains::world::Train*const&>
                        ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                          *)__return_storage_ptr__,iVar4,(Train **)&local_b0);
            }
            else {
              *iVar4._M_current = (Train *)local_b0._vptr_Writer;
              pppTVar1 = &(__return_storage_ptr__->
                          super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
          }
        }
        ppLVar20 = ppLVar20 + 1;
      } while (ppLVar20 != local_38);
    }
  }
  pLVar13 = local_40;
  if (local_d4 < 2) {
    pPVar10 = Line::getStartPont(local_40);
    Point::getTrains((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      *)&local_b0,pPVar10);
    pTVar5 = (Train *)CONCAT44(local_b0._12_4_,local_b0.m_level);
    if ((Train *)local_b0._vptr_Writer != pTVar5) {
      pTVar21 = (Train *)local_b0._vptr_Writer;
      do {
        local_c8.
        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(pTVar21->super_IUpgradeble)._vptr_IUpgradeble;
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>::
          _M_realloc_insert<tiger::trains::world::Train*const&>
                    ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                      *)__return_storage_ptr__,iVar4,(Train **)&local_c8);
        }
        else {
          *iVar4._M_current =
               (Train *)local_c8.
                        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          pppTVar1 = &(__return_storage_ptr__->
                      super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        pTVar21 = (Train *)&pTVar21->idx;
      } while (pTVar21 != pTVar5);
    }
    if ((Train *)local_b0._vptr_Writer != (Train *)0x0) {
      operator_delete(local_b0._vptr_Writer,(long)local_b0.m_file - (long)local_b0._vptr_Writer);
    }
  }
  iVar7 = Line::getLenght(pLVar13);
  if (iVar7 + -2 < local_d4) {
    pPVar10 = Line::getEndPont(pLVar13);
    Point::getTrains((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      *)&local_b0,pPVar10);
    pTVar5 = (Train *)CONCAT44(local_b0._12_4_,local_b0.m_level);
    if ((Train *)local_b0._vptr_Writer != pTVar5) {
      pTVar21 = (Train *)local_b0._vptr_Writer;
      do {
        local_c8.
        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(pTVar21->super_IUpgradeble)._vptr_IUpgradeble;
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>::
          _M_realloc_insert<tiger::trains::world::Train*const&>
                    ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                      *)__return_storage_ptr__,iVar4,(Train **)&local_c8);
        }
        else {
          *iVar4._M_current =
               (Train *)local_c8.
                        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          pppTVar1 = &(__return_storage_ptr__->
                      super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        pTVar21 = (Train *)&pTVar21->idx;
      } while (pTVar21 != pTVar5);
    }
    if ((Train *)local_b0._vptr_Writer != (Train *)0x0) {
      operator_delete(local_b0._vptr_Writer,(long)local_b0.m_file - (long)local_b0._vptr_Writer);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Train *> Train::getPosibleCollisions(const models::MoveModel *move)
{
    int pos = position;
    const Line *lin = line;


    if (move!=nullptr)
    {
        if (move->getLineIdx() != lin->getIdx())
        {

            if (getPoint() == nullptr)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            std::vector<Line *> edges = getPoint()->getEdges();

            if (std::find(edges.begin(), edges.end(), owner->getLineByIdx(move->getLineIdx())) == edges.end())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            lin = owner->getLineByIdx(move->getLineIdx());
            pos = lin->getStartPont() == getPoint() ? 0 : lin->getLenght();
        }

        if (move->getSpeedType() == models::SpeedType::FORWARD)
        {
            if (pos == lin->getLenght())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos++;
        }

        if (move->getSpeedType() == models::SpeedType::REVERSE)
        {
            if (pos == 0)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos--;
        }
    }

    std::vector<Train *> res;

    for (Train *train : line->getTrains())
        if (train != this)
        {
            if (abs(pos - train->getPosition()) < 2)
                res.push_back(train);
        }

    Point *point = nullptr;

    if (pos == 0)
        point = lin->getStartPont();

    if (pos == lin->getLenght())
        point = lin->getStartPont();

    if (point)
        for (Line *edg: point->getEdges())
            for (Train *train : edg->getTrains())
            {
                if (edg->getStartPont() == point && train->getPosition() < 2)
                    res.push_back(train);

                if (edg->getEndPont() == point && train->getPosition() > edg->getLenght() - 2)
                    res.push_back(train);
            }

    if (pos < 2)
        for (Train *train : lin->getStartPont()->getTrains())
            res.push_back(train);

    if (pos > lin->getLenght() - 2)
        for (Train *train : lin->getEndPont()->getTrains())
            res.push_back(train);

    return res;
}